

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QPoint __thiscall QVariant::toPoint(QVariant *this)

{
  QPoint QVar1;
  
  QVar1 = qvariant_cast<QPoint>(this);
  return QVar1;
}

Assistant:

QPoint QVariant::toPoint() const
{
    return qvariant_cast<QPoint>(*this);
}